

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::splatI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  undefined1 auStack_58 [8];
  LaneArray<2> lanes;
  
  if ((this->type).id == 3) {
    lanes._M_elems[1].field_0.i64 = 0;
    lanes._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
    lanes._M_elems[0].type.id = 0;
    auStack_58 = (undefined1  [8])0x0;
    lanes._M_elems[0].field_0.i64 = 0;
    lVar1 = 0;
    do {
      this_00 = (Literal *)((long)lanes._M_elems + lVar1 + -8);
      if (this_00 != this) {
        ~Literal(this_00);
        Literal(this_00,this);
      }
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x30);
    Literal(__return_storage_ptr__,(LaneArray<2> *)auStack_58);
    lVar1 = 0x18;
    do {
      ~Literal((Literal *)((long)lanes._M_elems + lVar1 + -8));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0x71a,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i64, Lanes = 2]");
}

Assistant:

Literal Literal::splatI64x2() const { return splat<Type::i64, 2>(*this); }